

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

ImfHeader * ImfCopyHeader(ImfHeader *hdr)

{
  ImfHeader *pIVar1;
  ImfHeader *in_RDI;
  Header *unaff_retaddr;
  exception *e;
  Header *in_stack_fffffffffffffff8;
  
  pIVar1 = (ImfHeader *)operator_new(0x38);
  anon_unknown.dwarf_70604::header(in_RDI);
  Imf_3_4::Header::Header(unaff_retaddr,in_stack_fffffffffffffff8);
  return pIVar1;
}

Assistant:

ImfHeader*
ImfCopyHeader (const ImfHeader* hdr)
{
    try
    {
        return (ImfHeader*) new OPENEXR_IMF_INTERNAL_NAMESPACE::Header (
            *header (hdr));
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}